

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

ssize_t __thiscall
LatencySimulator::send(LatencySimulator *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  DelayPacket *this_00;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar5;
  int local_48;
  uint32_t delay;
  DelayPacket *local_38;
  DelayPacket *pkt;
  DelayTunnel *tunnel;
  void *pvStack_20;
  int size_local;
  void *data_local;
  LatencySimulator *pLStack_10;
  int peer_local;
  LatencySimulator *this_local;
  
  tunnel._4_4_ = (int)__n;
  pkt = (DelayPacket *)&this->p12;
  pvStack_20 = __buf;
  data_local._4_4_ = __fd;
  pLStack_10 = this;
  if (__fd == 1) {
    this->tx1 = this->tx1 + 1;
    lVar3 = Random::random(&this->r12);
    if ((int)lVar3 < this->lostrate) {
      return lVar3;
    }
    sVar4 = std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::size(&this->p12);
    if (this->nmax <= (int)sVar4) {
      return sVar4;
    }
  }
  else {
    pkt = (DelayPacket *)&this->p21;
    this->tx2 = this->tx2 + 1;
    lVar3 = Random::random(&this->r21);
    if ((int)lVar3 < this->lostrate) {
      return lVar3;
    }
    sVar4 = std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::size(&this->p21);
    if (this->nmax <= (int)sVar4) {
      return sVar4;
    }
  }
  this_00 = (DelayPacket *)operator_new(0x18);
  DelayPacket::DelayPacket(this_00,tunnel._4_4_,pvStack_20);
  local_38 = this_00;
  uVar1 = iclock();
  this->current = uVar1;
  local_48 = this->rttmin;
  if (this->rttmin < this->rttmax) {
    iVar2 = rand();
    local_48 = iVar2 % (this->rttmax - this->rttmin) + local_48;
  }
  DelayPacket::setts(local_38,this->current + local_48);
  if (data_local._4_4_ == 1) {
    std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::push_back
              (&this->p12,&local_38);
    sVar5 = extraout_RAX;
  }
  else {
    std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::push_back
              (&this->p21,&local_38);
    sVar5 = extraout_RAX_00;
  }
  return sVar5;
}

Assistant:

void send(int peer, const void *data, int size) {
//        DelayTunnel &tunnel = p12;
//        Random &r = r12;
//        tx1++;
        DelayTunnel *tunnel = &p12;
        if (peer == 1) {
            tx1++;
            if (r12.random() < lostrate) {
//                fprintf(stderr, "drop. lost rate test.\n");
                return;
            }
            if ((int) p12.size() >= nmax) return;
        } else {
            tunnel = &p21;
            tx2++;
            if (r21.random() < lostrate) {
//                fprintf(stderr, "drop. lost rate test.\n");
                return;  //todo: uncoment for lost rate test
            }
            if ((int) p21.size() >= nmax) return;
        }


        DelayPacket *pkt = new DelayPacket(size, data);
        current = iclock();
        uint32_t delay = rttmin;
        if (rttmax > rttmin) delay += rand() % (rttmax - rttmin);
//		fprintf(stderr, "delay: %dms\n", delay);
        pkt->setts(current + delay);
        if (peer == 1) {
//            if (!(tx1 % 3)) {    // simulate packet loss
//                fprintf(stderr, "peer 1 send: drop packt. tx1 = %d\n", tx1);
//                delete pkt;
//                return;
//            }
            p12.push_back(pkt);
        } else {
//            if (!(tx2 % 5)) {
//                fprintf(stderr, "peer 2 send: drop packt. tx2 = %d\n", tx2);
//                delete pkt;
//                return;
//            }
            p21.push_back(pkt);
        }

//        fprintf(stderr, "send, tunnel: %p, size: %d, pkt: %p, _ptr: %p\n", tunnel, tunnel->size(),  pkt, pkt->ptr());

    }